

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteFuncDeclaration
          (CWriter *this,FuncDeclaration *decl,string *name)

{
  uint uVar1;
  Index IVar2;
  string_view local_68;
  Enum local_54;
  string_view local_50;
  uint local_3c;
  undefined1 auStack_38 [4];
  Index i;
  ResultType local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  FuncDeclaration *decl_local;
  CWriter *this_local;
  
  local_20 = name;
  name_local = (string *)decl;
  decl_local = (FuncDeclaration *)this;
  ResultType::ResultType(&local_28,&(decl->sig).result_types);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::ResultType,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,&local_28,(char (*) [2])0x2daf06,local_20,(char (*) [2])0x2d2c67);
  IVar2 = FuncDeclaration::GetNumParams((FuncDeclaration *)name_local);
  if (IVar2 == 0) {
    string_view::string_view((string_view *)auStack_38,"void");
    Write(this,_auStack_38);
  }
  else {
    for (local_3c = 0; uVar1 = local_3c,
        IVar2 = FuncDeclaration::GetNumParams((FuncDeclaration *)name_local), uVar1 < IVar2;
        local_3c = local_3c + 1) {
      if (local_3c != 0) {
        string_view::string_view(&local_50,", ");
        Write(this,local_50);
      }
      local_54 = (Enum)FuncDeclaration::GetParamType((FuncDeclaration *)name_local,local_3c);
      Write(this,(Type)local_54);
    }
  }
  string_view::string_view(&local_68,")");
  Write(this,local_68);
  return;
}

Assistant:

void CWriter::WriteFuncDeclaration(const FuncDeclaration& decl,
                                   const std::string& name) {
  Write(ResultType(decl.sig.result_types), " ", name, "(");
  if (decl.GetNumParams() == 0) {
    Write("void");
  } else {
    for (Index i = 0; i < decl.GetNumParams(); ++i) {
      if (i != 0)
        Write(", ");
      Write(decl.GetParamType(i));
    }
  }
  Write(")");
}